

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O1

int Au_NtkMemUsage(Au_Ntk_t *p)

{
  return p->nObjsAlloc * 0x10 + ((p->vPos).nCap + (p->vPis).nCap + (p->vObjs).nCap) * 4 + 0x100;
}

Assistant:

int Au_NtkMemUsage( Au_Ntk_t * p )
{
    int Mem = sizeof(Au_Ntk_t);
    Mem += 4 * p->vPis.nCap;
    Mem += 4 * p->vPos.nCap;
    Mem += 4 * p->vObjs.nCap;
    Mem += 16 * p->nObjsAlloc;
    return Mem;
}